

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSources::CreateOwnSSRC(RTPSources *this,uint32_t ssrc)

{
  bool bVar1;
  bool local_21;
  int local_20;
  uint32_t uStack_1c;
  bool created;
  int status;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    uStack_1c = ssrc;
    _status = this;
    bVar1 = GotEntry(this,ssrc);
    if (bVar1) {
      this_local._4_4_ = -0x44;
    }
    else {
      local_20 = ObtainSourceDataInstance(this,uStack_1c,&this->owndata,&local_21);
      if (local_20 < 0) {
        this->owndata = (RTPInternalSourceData *)0x0;
        this_local._4_4_ = local_20;
      }
      else {
        RTPInternalSourceData::SetOwnSSRC(this->owndata);
        RTPInternalSourceData::SetRTPDataAddress(this->owndata,(RTPAddress *)0x0);
        RTPInternalSourceData::SetRTCPDataAddress(this->owndata,(RTPAddress *)0x0);
        this->activecount = this->activecount + 1;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,this->owndata);
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -0x41;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::CreateOwnSSRC(uint32_t ssrc)
{
	if (owndata != 0)
		return ERR_RTP_SOURCES_ALREADYHAVEOWNSSRC;
	if (GotEntry(ssrc))
		return ERR_RTP_SOURCES_SSRCEXISTS;

	int status;
	bool created;
	
	status = ObtainSourceDataInstance(ssrc,&owndata,&created);
	if (status < 0)
	{
		owndata = 0; // just to make sure
		return status;
	}
	owndata->SetOwnSSRC();	
	owndata->SetRTPDataAddress(0);
	owndata->SetRTCPDataAddress(0);

	// we've created a validated ssrc, so we should increase activecount
	activecount++;

	OnNewSource(owndata);
	return 0;
}